

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::add_token_comment(Lexer *this)

{
  size_type sVar1;
  uchar *__first;
  pointer pTVar2;
  TokenKind local_1c;
  unsigned_long local_18;
  unsigned_long local_10;
  
  trim_string(&this->tok_id);
  sVar1 = (this->tok_id)._M_string_length;
  if (sVar1 != 0) {
    __first = (uchar *)(this->tok_id)._M_dataplus._M_p;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&(this->data).comments,
               (const_iterator)
               (this->data).comments.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,__first,__first + sVar1);
    pTVar2 = (this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_start == pTVar2) || (pTVar2[-1].kind != Comment)) {
      local_1c = Comment;
      local_18 = (long)(this->data).comments.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->data).comments.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      local_10 = local_18 - (this->tok_id)._M_string_length;
      std::vector<Token,std::allocator<Token>>::
      emplace_back<TokenKind,TextPos_const&,unsigned_long,unsigned_long>
                ((vector<Token,std::allocator<Token>> *)&(this->data).tokens,&local_1c,
                 &(this->reader).pos_,&local_10,&local_18);
    }
    else {
      pTVar2[-1].j = *(int *)&(this->data).comments.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->data).comments.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
    }
    (this->tok_id)._M_string_length = 0;
    *(this->tok_id)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void Lexer::add_token_comment()
{
  trim_string(tok_id);
  if (!tok_id.empty()) {
    data.comments.insert(data.comments.end(),
                         (uint8_t*)&tok_id[0],
                         (uint8_t*)&tok_id[0]+tok_id.size());

    // Merge comments
    if (!data.tokens.empty() &&
        data.tokens.back().kind == TokenKind::Comment) {
      data.tokens.back().j = data.comments.size();
    }
    else {
      data.add_token(TokenKind::Comment,
                     reader.pos(),
                     data.comments.size()-tok_id.size(),
                     data.comments.size());
    }

    tok_id.clear();
  }
}